

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minmax.cpp
# Opt level: O2

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::BindMinMax<duckdb::MaxOperation,duckdb::MaxOperationString,duckdb::MaxOperationVector>
          (duckdb *this,ClientContext *context,AggregateFunction *function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  string *psVar1;
  bool bVar2;
  reference pvVar3;
  pointer pEVar4;
  DBConfig *pDVar5;
  AggregateFunctionCatalogEntry *pAVar6;
  idx_t offset;
  reference this_00;
  reference this_01;
  ParameterNotResolvedException *this_02;
  NotImplementedException *this_03;
  BinderException *this_04;
  InternalException *this_05;
  LogicalType *return_type;
  LogicalType *type;
  long lVar7;
  char *pcVar8;
  ErrorData *this_06;
  FunctionNullHandling in_R8B;
  initializer_list<duckdb::LogicalType> __l;
  initializer_list<duckdb::LogicalType> __l_00;
  string function_name;
  allocator local_279;
  LogicalType input_type;
  ErrorData error;
  optional_ptr<duckdb::AggregateFunctionCatalogEntry,_true> func;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  optional_idx best_function;
  type name;
  FunctionBinder function_binder;
  undefined1 local_180 [304];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  return_type = (LogicalType *)arguments;
  pvVar3 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::get<true>(arguments,0);
  pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (pvVar3);
  if ((pEVar4->return_type).id_ == VARCHAR) {
    pvVar3 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::get<true>(arguments,0);
    pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(pvVar3);
    StringType::GetCollation_abi_cxx11_(&name,(StringType *)&pEVar4->return_type,type);
    if ((name._M_string_length != 0) ||
       (pDVar5 = DBConfig::GetConfig(context), (pDVar5->options).collation._M_string_length != 0)) {
      psVar1 = &(function->super_BaseScalarFunction).super_SimpleFunction.super_Function.name;
      bVar2 = ::std::operator==(psVar1,"min");
      pcVar8 = "arg_max";
      if (bVar2) {
        pcVar8 = "arg_min";
      }
      ::std::__cxx11::string::string((string *)&function_name,pcVar8,(allocator *)local_180);
      ::std::__cxx11::string::string
                ((string *)local_180,anon_var_dwarf_4b71df5 + 9,(allocator *)&local_1d8);
      ::std::__cxx11::string::string
                ((string *)&error,anon_var_dwarf_4b71df5 + 9,(allocator *)&input_type);
      func = Catalog::GetEntry<duckdb::AggregateFunctionCatalogEntry>
                       (context,(string *)local_180,(string *)&error,&function_name,RETURN_NULL,
                        (QueryErrorContext)0xffffffffffffffff);
      ::std::__cxx11::string::~string((string *)&error);
      ::std::__cxx11::string::~string((string *)local_180);
      if (func.ptr == (AggregateFunctionCatalogEntry *)0x0) {
        this_03 = (NotImplementedException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)local_180,
                   "Failure while binding function \"%s\" using collations - arg_min/arg_max do not exist in the catalog - load the core_functions module to fix this issue"
                   ,(allocator *)&error);
        ::std::__cxx11::string::string((string *)&local_50,(string *)psVar1);
        NotImplementedException::NotImplementedException<std::__cxx11::string>
                  (this_03,(string *)local_180,&local_50);
        __cxa_throw(this_03,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error)
        ;
      }
      pAVar6 = optional_ptr<duckdb::AggregateFunctionCatalogEntry,_true>::operator*(&func);
      FunctionBinder::FunctionBinder(&function_binder,context);
      pvVar3 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               ::get<true>(arguments,0);
      pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(pvVar3);
      LogicalType::LogicalType((LogicalType *)local_180,&pEVar4->return_type);
      pvVar3 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               ::get<true>(arguments,0);
      pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(pvVar3);
      LogicalType::LogicalType((LogicalType *)(local_180 + 0x18),&pEVar4->return_type);
      __l._M_len = 2;
      __l._M_array = (iterator)local_180;
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&input_type,
                 __l,(allocator_type *)&error);
      lVar7 = 0x18;
      do {
        LogicalType::~LogicalType((LogicalType *)(local_180 + lVar7));
        lVar7 = lVar7 + -0x18;
      } while (lVar7 != -0x18);
      ErrorData::ErrorData(&error);
      best_function =
           FunctionBinder::BindFunction
                     (&function_binder,
                      &(pAVar6->super_FunctionEntry).super_StandardEntry.super_InCatalogEntry.
                       super_CatalogEntry.name,&pAVar6->functions,
                      (vector<duckdb::LogicalType,_true> *)&input_type,&error);
      if (best_function.index != 0xffffffffffffffff) {
        offset = optional_idx::GetIndex(&best_function);
        FunctionSet<duckdb::AggregateFunction>::GetFunctionByOffset
                  ((AggregateFunction *)local_180,
                   &(pAVar6->functions).super_FunctionSet<duckdb::AggregateFunction>,offset);
        AggregateFunction::operator=(function,(AggregateFunction *)local_180);
        AggregateFunction::~AggregateFunction((AggregateFunction *)local_180);
        pvVar3 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                 ::get<true>(arguments,0);
        pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator->(pvVar3);
        (*(pEVar4->super_BaseExpression)._vptr_BaseExpression[0x11])(local_180,pEVar4);
        ::std::
        vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                    *)arguments,
                   (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   local_180);
        if ((long *)local_180._0_8_ != (long *)0x0) {
          (**(code **)(*(long *)local_180._0_8_ + 8))();
        }
        pvVar3 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                 ::get<true>(arguments,1);
        this_00 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                  ::get<true>(arguments,0);
        pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator->(this_00);
        ExpressionBinder::PushCollation(context,pvVar3,&pEVar4->return_type,ALL_COLLATIONS);
        pvVar3 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                 ::get<true>(arguments,0);
        pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator->(pvVar3);
        this_01 = vector<duckdb::LogicalType,_true>::get<true>
                            (&(function->super_BaseScalarFunction).super_SimpleFunction.arguments,0)
        ;
        LogicalType::operator=(this_01,&pEVar4->return_type);
        pvVar3 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                 ::get<true>(arguments,0);
        pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator->(pvVar3);
        LogicalType::operator=
                  (&(function->super_BaseScalarFunction).return_type,&pEVar4->return_type);
        *(undefined8 *)this = 0;
        ErrorData::~ErrorData(&error);
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                  ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&input_type)
        ;
        ::std::__cxx11::string::~string((string *)&function_name);
        ::std::__cxx11::string::~string((string *)&name);
        return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
               (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)this;
      }
      this_04 = (BinderException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_1d8,"Fail to find corresponding function for collation min/max: ",
                 &local_279);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_180,&local_1d8,&error.final_message);
      BinderException::BinderException(this_04,(string *)local_180);
      __cxa_throw(this_04,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
    ::std::__cxx11::string::~string((string *)&name);
  }
  pvVar3 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::get<true>(arguments,0);
  pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (pvVar3);
  LogicalType::LogicalType(&input_type,&pEVar4->return_type);
  if (input_type.id_ == UNKNOWN) {
    this_02 = (ParameterNotResolvedException *)__cxa_allocate_exception(0x10);
    ParameterNotResolvedException::ParameterNotResolvedException(this_02);
    __cxa_throw(this_02,&ParameterNotResolvedException::typeinfo,
                ::std::runtime_error::~runtime_error);
  }
  psVar1 = &(function->super_BaseScalarFunction).super_SimpleFunction.super_Function.name;
  ::std::__cxx11::string::string((string *)&name,(string *)psVar1);
  if ((input_type.physical_type_ < 0x1e) &&
     (return_type = (LogicalType *)0x21800000,
     (0x21800000U >> (input_type.physical_type_ & 0x1f) & 1) != 0)) {
    LogicalType::LogicalType((LogicalType *)&function_name,&input_type);
    __l_00._M_len = 1;
    __l_00._M_array = (iterator)&function_name;
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
              ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&error,__l_00,
               (allocator_type *)&function_binder);
    LogicalType::LogicalType((LogicalType *)&local_1d8,BLOB);
    AggregateFunction::AggregateFunction
              ((AggregateFunction *)local_180,(vector<duckdb::LogicalType,_true> *)&error,
               (LogicalType *)&local_1d8,AggregateFunction::StateSize<duckdb::MinMaxStringState>,
               AggregateFunction::
               StateInitialize<duckdb::MinMaxStringState,duckdb::MaxOperationVector,(duckdb::AggregateDestructorType)0>
               ,AggregateSortKeyHelpers::
                UnaryUpdate<duckdb::MinMaxStringState,duckdb::MaxOperationVector,(duckdb::OrderType)3,false>
               ,AggregateFunction::
                StateCombine<duckdb::MinMaxStringState,duckdb::MaxOperationVector>,
               AggregateFunction::
               StateVoidFinalize<duckdb::MinMaxStringState,duckdb::MaxOperationVector>,
               (aggregate_simple_update_t)0x0,VectorMinMaxBase<(duckdb::OrderType)3>::Bind,
               AggregateFunction::StateDestroy<duckdb::MinMaxStringState,duckdb::MaxOperationVector>
               ,(aggregate_statistics_t)0x0,(aggregate_window_t)0x0,(aggregate_serialize_t)0x0,
               (aggregate_deserialize_t)0x0);
    LogicalType::~LogicalType((LogicalType *)&local_1d8);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
              ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&error);
  }
  else {
    if (input_type.physical_type_ == VARCHAR) {
      LogicalType::LogicalType((LogicalType *)&error,&input_type);
      LogicalType::LogicalType((LogicalType *)&function_name,&input_type);
      AggregateFunction::
      UnaryAggregateDestructor<duckdb::MinMaxStringState,duckdb::string_t,duckdb::string_t,duckdb::MaxOperationString,(duckdb::AggregateDestructorType)0>
                ((AggregateFunction *)local_180,(AggregateFunction *)&error,
                 (LogicalType *)&function_name,return_type);
      LogicalType::~LogicalType((LogicalType *)&function_name);
      this_06 = &error;
      goto LAB_00697a41;
    }
    LogicalType::LogicalType((LogicalType *)&function_name,&input_type);
    switch(function_name._M_dataplus._M_p._1_1_) {
    case '\x01':
      LogicalType::LogicalType((LogicalType *)&error,(LogicalType *)&function_name);
      AggregateFunction::
      UnaryAggregate<duckdb::MinMaxState<signed_char>,signed_char,signed_char,duckdb::MaxOperation,(duckdb::AggregateDestructorType)0>
                ((AggregateFunction *)local_180,(AggregateFunction *)&function_name,
                 (LogicalType *)&error,(LogicalType *)0x0,in_R8B);
      break;
    case '\x02':
      LogicalType::LogicalType((LogicalType *)&error,(LogicalType *)&function_name);
      AggregateFunction::
      UnaryAggregate<duckdb::MinMaxState<unsigned_char>,unsigned_char,unsigned_char,duckdb::MaxOperation,(duckdb::AggregateDestructorType)0>
                ((AggregateFunction *)local_180,(AggregateFunction *)&function_name,
                 (LogicalType *)&error,(LogicalType *)0x0,in_R8B);
      break;
    case '\x03':
      LogicalType::LogicalType((LogicalType *)&error,(LogicalType *)&function_name);
      AggregateFunction::
      UnaryAggregate<duckdb::MinMaxState<signed_char>,signed_char,signed_char,duckdb::MaxOperation,(duckdb::AggregateDestructorType)0>
                ((AggregateFunction *)local_180,(AggregateFunction *)&function_name,
                 (LogicalType *)&error,(LogicalType *)0x0,in_R8B);
      break;
    case '\x04':
      LogicalType::LogicalType((LogicalType *)&error,(LogicalType *)&function_name);
      AggregateFunction::
      UnaryAggregate<duckdb::MinMaxState<unsigned_short>,unsigned_short,unsigned_short,duckdb::MaxOperation,(duckdb::AggregateDestructorType)0>
                ((AggregateFunction *)local_180,(AggregateFunction *)&function_name,
                 (LogicalType *)&error,(LogicalType *)0x0,in_R8B);
      break;
    case '\x05':
      LogicalType::LogicalType((LogicalType *)&error,(LogicalType *)&function_name);
      AggregateFunction::
      UnaryAggregate<duckdb::MinMaxState<short>,short,short,duckdb::MaxOperation,(duckdb::AggregateDestructorType)0>
                ((AggregateFunction *)local_180,(AggregateFunction *)&function_name,
                 (LogicalType *)&error,(LogicalType *)0x0,in_R8B);
      break;
    case '\x06':
      LogicalType::LogicalType((LogicalType *)&error,(LogicalType *)&function_name);
      AggregateFunction::
      UnaryAggregate<duckdb::MinMaxState<unsigned_int>,unsigned_int,unsigned_int,duckdb::MaxOperation,(duckdb::AggregateDestructorType)0>
                ((AggregateFunction *)local_180,(AggregateFunction *)&function_name,
                 (LogicalType *)&error,(LogicalType *)0x0,in_R8B);
      break;
    case '\a':
      LogicalType::LogicalType((LogicalType *)&error,(LogicalType *)&function_name);
      AggregateFunction::
      UnaryAggregate<duckdb::MinMaxState<int>,int,int,duckdb::MaxOperation,(duckdb::AggregateDestructorType)0>
                ((AggregateFunction *)local_180,(AggregateFunction *)&function_name,
                 (LogicalType *)&error,(LogicalType *)0x0,in_R8B);
      break;
    case '\b':
      LogicalType::LogicalType((LogicalType *)&error,(LogicalType *)&function_name);
      AggregateFunction::
      UnaryAggregate<duckdb::MinMaxState<unsigned_long>,unsigned_long,unsigned_long,duckdb::MaxOperation,(duckdb::AggregateDestructorType)0>
                ((AggregateFunction *)local_180,(AggregateFunction *)&function_name,
                 (LogicalType *)&error,(LogicalType *)0x0,in_R8B);
      break;
    case '\t':
      LogicalType::LogicalType((LogicalType *)&error,(LogicalType *)&function_name);
      AggregateFunction::
      UnaryAggregate<duckdb::MinMaxState<long>,long,long,duckdb::MaxOperation,(duckdb::AggregateDestructorType)0>
                ((AggregateFunction *)local_180,(AggregateFunction *)&function_name,
                 (LogicalType *)&error,(LogicalType *)0x0,in_R8B);
      break;
    case '\n':
    case '\r':
    case '\x0e':
    case '\x0f':
    case '\x10':
    case '\x11':
    case '\x12':
    case '\x13':
    case '\x14':
switchD_00697779_caseD_a:
      this_05 = (InternalException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&error,"Unimplemented type for min/max aggregate",(allocator *)&local_1d8
                );
      InternalException::InternalException(this_05,(string *)&error);
      __cxa_throw(this_05,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    case '\v':
      LogicalType::LogicalType((LogicalType *)&error,(LogicalType *)&function_name);
      AggregateFunction::
      UnaryAggregate<duckdb::MinMaxState<float>,float,float,duckdb::MaxOperation,(duckdb::AggregateDestructorType)0>
                ((AggregateFunction *)local_180,(AggregateFunction *)&function_name,
                 (LogicalType *)&error,(LogicalType *)0x0,in_R8B);
      break;
    case '\f':
      LogicalType::LogicalType((LogicalType *)&error,(LogicalType *)&function_name);
      AggregateFunction::
      UnaryAggregate<duckdb::MinMaxState<double>,double,double,duckdb::MaxOperation,(duckdb::AggregateDestructorType)0>
                ((AggregateFunction *)local_180,(AggregateFunction *)&function_name,
                 (LogicalType *)&error,(LogicalType *)0x0,in_R8B);
      break;
    case '\x15':
      LogicalType::LogicalType((LogicalType *)&error,(LogicalType *)&function_name);
      AggregateFunction::
      UnaryAggregate<duckdb::MinMaxState<duckdb::interval_t>,duckdb::interval_t,duckdb::interval_t,duckdb::MaxOperation,(duckdb::AggregateDestructorType)0>
                ((AggregateFunction *)local_180,(AggregateFunction *)&function_name,
                 (LogicalType *)&error,(LogicalType *)0x0,in_R8B);
      break;
    default:
      if (function_name._M_dataplus._M_p._1_1_ == -0x35) {
        LogicalType::LogicalType((LogicalType *)&error,(LogicalType *)&function_name);
        AggregateFunction::
        UnaryAggregate<duckdb::MinMaxState<duckdb::uhugeint_t>,duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::MaxOperation,(duckdb::AggregateDestructorType)0>
                  ((AggregateFunction *)local_180,(AggregateFunction *)&function_name,
                   (LogicalType *)&error,(LogicalType *)0x0,in_R8B);
      }
      else {
        if (function_name._M_dataplus._M_p._1_1_ != -0x34) goto switchD_00697779_caseD_a;
        LogicalType::LogicalType((LogicalType *)&error,(LogicalType *)&function_name);
        AggregateFunction::
        UnaryAggregate<duckdb::MinMaxState<duckdb::hugeint_t>,duckdb::hugeint_t,duckdb::hugeint_t,duckdb::MaxOperation,(duckdb::AggregateDestructorType)0>
                  ((AggregateFunction *)local_180,(AggregateFunction *)&function_name,
                   (LogicalType *)&error,(LogicalType *)0x0,in_R8B);
      }
    }
    LogicalType::~LogicalType((LogicalType *)&error);
  }
  this_06 = (ErrorData *)&function_name;
LAB_00697a41:
  LogicalType::~LogicalType((LogicalType *)this_06);
  AggregateFunction::operator=(function,(AggregateFunction *)local_180);
  AggregateFunction::~AggregateFunction((AggregateFunction *)local_180);
  ::std::__cxx11::string::operator=((string *)psVar1,(string *)&name);
  function->order_dependent = NOT_ORDER_DEPENDENT;
  function->distinct_dependent = NOT_DISTINCT_DEPENDENT;
  if (function->bind == (bind_aggregate_function_t)0x0) {
    *(undefined8 *)this = 0;
  }
  else {
    (*function->bind)((ClientContext *)this,(AggregateFunction *)context,
                      (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                       *)function);
  }
  ::std::__cxx11::string::~string((string *)&name);
  LogicalType::~LogicalType(&input_type);
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)this;
}

Assistant:

unique_ptr<FunctionData> BindMinMax(ClientContext &context, AggregateFunction &function,
                                    vector<unique_ptr<Expression>> &arguments) {
	if (arguments[0]->return_type.id() == LogicalTypeId::VARCHAR) {
		auto str_collation = StringType::GetCollation(arguments[0]->return_type);
		if (!str_collation.empty() || !DBConfig::GetConfig(context).options.collation.empty()) {
			// If aggr function is min/max and uses collations, replace bound_function with arg_min/arg_max
			// to make sure the result's correctness.
			string function_name = function.name == "min" ? "arg_min" : "arg_max";
			QueryErrorContext error_context;
			auto func = Catalog::GetEntry<AggregateFunctionCatalogEntry>(context, "", "", function_name,
			                                                             OnEntryNotFound::RETURN_NULL, error_context);
			if (!func) {
				throw NotImplementedException(
				    "Failure while binding function \"%s\" using collations - arg_min/arg_max do not exist in the "
				    "catalog - load the core_functions module to fix this issue",
				    function.name);
			}

			auto &func_entry = *func;

			FunctionBinder function_binder(context);
			vector<LogicalType> types {arguments[0]->return_type, arguments[0]->return_type};
			ErrorData error;
			auto best_function = function_binder.BindFunction(func_entry.name, func_entry.functions, types, error);
			if (!best_function.IsValid()) {
				throw BinderException(string("Fail to find corresponding function for collation min/max: ") +
				                      error.Message());
			}
			function = func_entry.functions.GetFunctionByOffset(best_function.GetIndex());

			// Create a copied child and PushCollation for it.
			arguments.push_back(arguments[0]->Copy());
			ExpressionBinder::PushCollation(context, arguments[1], arguments[0]->return_type);

			// Bind function like arg_min/arg_max.
			function.arguments[0] = arguments[0]->return_type;
			function.return_type = arguments[0]->return_type;
			return nullptr;
		}
	}

	auto input_type = arguments[0]->return_type;
	if (input_type.id() == LogicalTypeId::UNKNOWN) {
		throw ParameterNotResolvedException();
	}
	auto name = std::move(function.name);
	function = GetMinMaxOperator<OP, OP_STRING, OP_VECTOR>(input_type);
	function.name = std::move(name);
	function.order_dependent = AggregateOrderDependent::NOT_ORDER_DEPENDENT;
	function.distinct_dependent = AggregateDistinctDependent::NOT_DISTINCT_DEPENDENT;
	if (function.bind) {
		return function.bind(context, function, arguments);
	} else {
		return nullptr;
	}
}